

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall fasttext::Autotune::printInfo(Autotune *this,double maxDuration)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ClockPrint local_1c;
  
  auVar5._0_8_ = (this->elapsed_ * 100.0) / maxDuration;
  auVar5._8_8_ = 0;
  auVar5 = vminsd_avx(ZEXT816(0x4059000000000000),auVar5);
  std::operator<<((ostream *)&std::cerr,"\r");
  *(uint *)(std::istream::_M_extract<float> + *(long *)(std::cerr + -0x18)) =
       *(uint *)(std::istream::_M_extract<float> + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
  std::operator<<((ostream *)&std::cerr,"Progress: ");
  lVar2 = std::cerr;
  *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 1;
  *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(lVar2 + -0x18)) = 5;
  poVar3 = std::ostream::_M_insert<double>(auVar5._0_8_);
  std::operator<<(poVar3,"%");
  poVar3 = std::operator<<((ostream *)&std::cerr," Trials: ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  std::ostream::operator<<(poVar3,this->trials_);
  poVar3 = std::operator<<((ostream *)&std::cerr," Best score: ");
  lVar2 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 8) = 6;
  dVar1 = this->bestScore_;
  if ((dVar1 != -1.0) || (NAN(dVar1))) {
    std::ostream::_M_insert<double>(dVar1);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"unknown");
  }
  poVar3 = std::operator<<((ostream *)&std::cerr," ETA: ");
  auVar4._8_8_ = 0;
  auVar4._0_8_ = maxDuration - this->elapsed_;
  auVar5 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
  utils::ClockPrint::ClockPrint(&local_1c,(int)auVar5._0_8_);
  utils::operator<<(poVar3,&local_1c);
  std::ostream::flush();
  return;
}

Assistant:

void Autotune::printInfo(double maxDuration) {
  double progress = elapsed_ * 100 / maxDuration;
  progress = std::min(progress, 100.0);

  std::cerr << "\r";
  std::cerr << std::fixed;
  std::cerr << "Progress: ";
  std::cerr << std::setprecision(1) << std::setw(5) << progress << "%";
  std::cerr << " Trials: " << std::setw(4) << trials_;
  std::cerr << " Best score: " << std::setw(9) << std::setprecision(6);
  if (bestScore_ == kUnknownBestScore) {
    std::cerr << "unknown";
  } else {
    std::cerr << bestScore_;
  }
  std::cerr << " ETA: "
            << utils::ClockPrint(std::max(maxDuration - elapsed_, 0.0));
  std::cerr << std::flush;
}